

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookmempool.h
# Opt level: O0

bool __thiscall
cookmem::MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void>::
contains(MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> *this
        ,void *ptr,bool checkUsed)

{
  bool bVar1;
  size_type sVar2;
  MemChunk *this_00;
  MemChunk *chunk;
  MemSegment *seg;
  bool checkUsed_local;
  void *ptr_local;
  MemPool<cookmem::CachedArena<cookmem::MallocArena>,_cookmem::NoActionMemLogger,_void> *this_local;
  
  chunk = (MemChunk *)this->m_segList;
  while( true ) {
    if (chunk == (MemChunk *)0x0) {
      return false;
    }
    if ((chunk <= ptr) &&
       (sVar2 = MemSegment::getSize((MemSegment *)chunk),
       ptr <= (void *)((long)&chunk->m_prevFootSize + sVar2))) break;
    chunk = (MemChunk *)MemSegment::getNext((MemSegment *)chunk);
  }
  if (checkUsed) {
    this_00 = mem2Chunk(ptr);
    bVar1 = MemChunk::isUsed(this_00);
    return bVar1;
  }
  return true;
}

Assistant:

bool
    contains (T* ptr, bool checkUsed = false)
    {
        MemSegment* seg = m_segList;
        while (seg)
        {
            if (reinterpret_cast<char*>(ptr) >= reinterpret_cast<char*>(seg) &&
                reinterpret_cast<char*>(ptr) <= (reinterpret_cast<char*>(seg) + seg->getSize ()))
            {
                if (checkUsed)
                {
                    MemChunk* chunk = mem2Chunk (ptr);
                    return chunk->isUsed ();
                }
                return true;
            }
            seg = seg->getNext ();
        }
        return false;
    }